

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localize.h
# Opt level: O0

void __thiscall
wasm::ChildLocalizer::ChildLocalizer
          (ChildLocalizer *this,Expression *input,Function *func,Module *wasm,PassOptions *options)

{
  bool bVar1;
  Expression ***pppEVar2;
  reference pvVar3;
  reference other;
  LocalGet *pLVar4;
  LocalSet *local_f8;
  uintptr_t local_f0;
  Index local_e8;
  uint local_e4;
  Index local;
  Index j;
  bool needLocal;
  Expression *pEStack_d8;
  Expression *child_1;
  Expression **childp;
  Expression *pEStack_c0;
  Index i_1;
  Expression *child;
  undefined1 local_b0 [4];
  Index i;
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> effects;
  size_t num;
  SmallVector<wasm::Expression_**,_4UL> *children;
  ChildIterator iterator;
  Builder local_38;
  Builder builder;
  PassOptions *options_local;
  Module *wasm_local;
  Function *func_local;
  Expression *input_local;
  ChildLocalizer *this_local;
  
  builder.wasm = (Module *)options;
  std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::vector(&this->sets);
  Builder::Builder(&local_38,wasm);
  ChildIterator::ChildIterator((ChildIterator *)&children,input);
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)SmallVector<wasm::Expression_**,_4UL>::size
                          ((SmallVector<wasm::Expression_**,_4UL> *)&children);
  std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::vector
            ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)local_b0);
  for (child._4_4_ = 0;
      (pointer)(ulong)child._4_4_ <
      effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage; child._4_4_ = child._4_4_ + 1) {
    pppEVar2 = SmallVector<wasm::Expression_**,_4UL>::operator[]
                         ((SmallVector<wasm::Expression_**,_4UL> *)&children,
                          (size_t)(&(effects.
                                     super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                    ignoreImplicitTraps + ~(ulong)child._4_4_));
    pEStack_c0 = **pppEVar2;
    std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
    emplace_back<wasm::PassOptions_const&,wasm::Module&,wasm::Expression*&>
              ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)local_b0,
               (PassOptions *)builder.wasm,wasm,&stack0xffffffffffffff40);
  }
  for (childp._4_4_ = 0;
      (pointer)(ulong)childp._4_4_ <
      effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage; childp._4_4_ = childp._4_4_ + 1) {
    pppEVar2 = SmallVector<wasm::Expression_**,_4UL>::operator[]
                         ((SmallVector<wasm::Expression_**,_4UL> *)&children,
                          (size_t)(&(effects.
                                     super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                    ignoreImplicitTraps + ~(ulong)childp._4_4_));
    child_1 = (Expression *)*pppEVar2;
    pEStack_d8 = *(Expression **)child_1;
    j = 1;
    bVar1 = wasm::Type::operator==(&pEStack_d8->type,&j);
    if (bVar1) break;
    pvVar3 = std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::operator[]
                       ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
                        local_b0,(ulong)childp._4_4_);
    local._3_1_ = EffectAnalyzer::hasUnremovableSideEffects(pvVar3);
    if (!(bool)local._3_1_) {
      for (local_e4 = 0;
          (pointer)(ulong)local_e4 <
          effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage; local_e4 = local_e4 + 1) {
        if (local_e4 != childp._4_4_) {
          pvVar3 = std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::
                   operator[]((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *
                              )local_b0,(ulong)childp._4_4_);
          other = std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::
                  operator[]((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)
                             local_b0,(ulong)local_e4);
          bVar1 = EffectAnalyzer::invalidates(pvVar3,other);
          if (bVar1) {
            local._3_1_ = 1;
            break;
          }
        }
      }
    }
    if ((local._3_1_ & 1) != 0) {
      local_f0 = (pEStack_d8->type).id;
      local_e8 = Builder::addVar(func,(Type)local_f0);
      local_f8 = Builder::makeLocalSet(&local_38,local_e8,pEStack_d8);
      std::vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>::push_back
                (&this->sets,&local_f8);
      pLVar4 = Builder::makeLocalGet(&local_38,local_e8,(Type)(pEStack_d8->type).id);
      *(LocalGet **)child_1 = pLVar4;
    }
  }
  std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
            ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)local_b0);
  ChildIterator::~ChildIterator((ChildIterator *)&children);
  return;
}

Assistant:

ChildLocalizer(Expression* input,
                 Function* func,
                 Module* wasm,
                 const PassOptions& options) {
    Builder builder(*wasm);
    ChildIterator iterator(input);
    auto& children = iterator.children;
    auto num = children.size();

    // Compute the effects of all children.
    std::vector<EffectAnalyzer> effects;
    for (Index i = 0; i < num; i++) {
      // The children are in reverse order in ChildIterator, but we want to
      // process them in the normal order.
      auto* child = *children[num - 1 - i];
      effects.emplace_back(options, *wasm, child);
    }

    // Go through the children and move to locals those that we need to.
    for (Index i = 0; i < num; i++) {
      auto** childp = children[num - 1 - i];
      auto* child = *childp;
      if (child->type == Type::unreachable) {
        break;
      }

      // Use a local if we need to. That is the case either if this has side
      // effects we can't remove, or if it interacts with other children.
      bool needLocal = effects[i].hasUnremovableSideEffects();
      if (!needLocal) {
        for (Index j = 0; j < num; j++) {
          if (j != i && effects[i].invalidates(effects[j])) {
            needLocal = true;
            break;
          }
        }
      }
      if (needLocal) {
        auto local = builder.addVar(func, child->type);
        sets.push_back(builder.makeLocalSet(local, child));
        *childp = builder.makeLocalGet(local, child->type);
      }
    }
  }